

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

void __thiscall rw::Clump::render(Clump *this)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  
  pLVar1 = (this->atomics).link.next;
  while (pLVar2 = pLVar1, pLVar2 != &(this->atomics).link) {
    pLVar1 = pLVar2->next;
    if (((ulong)pLVar2[-6].prev & 0x40000) != 0) {
      (*(code *)pLVar2[1].prev)(&pLVar2[-6].prev);
    }
  }
  return;
}

Assistant:

void
Clump::render(void)
{
	Atomic *a;
	FORLIST(lnk, this->atomics){
		a = Atomic::fromClump(lnk);
		if(a->object.object.flags & Atomic::RENDER)
			a->render();
	}
}